

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

fdb_status
fdb_iterator_sequence_init
          (fdb_kvs_handle *handle,fdb_iterator **ptr_iterator,fdb_seqnum_t start_seq,
          fdb_seqnum_t end_seq,fdb_iterator_opt_t opt)

{
  uint32_t *puVar1;
  fdb_kvs_handle *pfVar2;
  ulong uVar3;
  hbtrie *trie;
  fdb_kvs_id_t id;
  wal_iterator *wal_itr;
  size_t __nmemb;
  size_t keylen;
  long lVar4;
  fdb_seqnum_t fVar5;
  fdb_status fVar6;
  fdb_iterator *iterator;
  char *pcVar7;
  hbtrie_iterator *it;
  btree_iterator *it_00;
  wal_item *pwVar8;
  ulong *initial_key;
  ulong *initial_key_00;
  ulong *puVar9;
  ulong chunksize;
  bool bVar10;
  size_t sStack_120;
  ulong uStack_118;
  wal_item local_110;
  wal_item_header local_90;
  ulong local_58;
  fdb_seqnum_t _start_seq;
  fdb_seqnum_t local_48;
  ulong local_40;
  long local_38;
  
  initial_key_00 = &uStack_118;
  if (handle == (fdb_kvs_handle *)0x0) {
    puVar9 = &sStack_120;
    sStack_120 = 0xffffffffffffffe2;
  }
  else {
    if (ptr_iterator == (fdb_iterator **)0x0) {
      return FDB_RESULT_INVALID_ARGS;
    }
    if (end_seq != 0 && end_seq < start_seq) {
      return FDB_RESULT_INVALID_ARGS;
    }
    local_40 = start_seq >> 0x38 | (start_seq & 0xff000000000000) >> 0x28 |
               (start_seq & 0xff0000000000) >> 0x18 | (start_seq & 0xff00000000) >> 8 |
               (start_seq & 0xff000000) << 8 | (start_seq & 0xff0000) << 0x18 |
               (start_seq & 0xff00) << 0x28 | start_seq << 0x38;
    local_58 = local_40;
    local_110.header = &local_90;
    if ((handle->config).seqtree_opt == '\x01') {
      _start_seq = (fdb_seqnum_t)ptr_iterator;
      local_48 = start_seq;
      if (handle->shandle == (snap_handle *)0x0) {
        sStack_120 = 0x13282c;
        fdb_check_file_reopen(handle,(file_status_t *)0x0);
        sStack_120 = 0x132834;
        fdb_sync_db_header(handle);
        bVar10 = handle->shandle == (snap_handle *)0x0;
      }
      else {
        bVar10 = false;
      }
      sStack_120 = 0x13284e;
      iterator = (fdb_iterator *)calloc(1,0x98);
      if (bVar10) {
        sStack_120 = 0x132864;
        fVar6 = fdb_snapshot_open(handle,(fdb_kvs_handle **)iterator,0xffffffffffffffff);
        if (fVar6 != FDB_RESULT_SUCCESS) {
          sStack_120 = 0x132880;
          pcVar7 = _fdb_kvs_get_name(handle,handle->file);
          fdb_log_impl(&handle->log_callback,2,fVar6,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                       ,"fdb_iterator_sequence_init",0x14a,
                       "Failed to create an sequence iterator instance due to the failure of open operation on the KV Store \'%s\' in a database file \'%s\'"
                       ,pcVar7,handle->file->filename);
          return fVar6;
        }
        bVar10 = false;
      }
      else {
        iterator->handle = handle;
        bVar10 = true;
      }
      fVar5 = local_48;
      iterator->snapshot_handle = bVar10;
      iterator->hbtrie_iterator = (hbtrie_iterator *)0x0;
      iterator->_key = (void *)0x0;
      iterator->_keylen = 0;
      iterator->opt = opt;
      iterator->_offset = 0xffffffffffffffff;
      iterator->_seqnum = local_48;
      (iterator->field_12).end_seqnum = -(ulong)(end_seq == 0) | end_seq;
      (iterator->field_10).start_seqnum = local_48;
      iterator->start_key = (void *)0x0;
      iterator->end_key = (void *)0x0;
      sStack_120 = 0x132931;
      wal_itr_init(handle->file,iterator->handle->shandle,false,&iterator->wal_itr);
      pfVar2 = iterator->handle;
      if (pfVar2->kvs == (kvs_info *)0x0) {
        sStack_120 = 0x1329bf;
        it_00 = (btree_iterator *)calloc(1,0x68);
        iterator->seqtree_iterator = it_00;
        initial_key = &local_58;
        if (fVar5 == 0) {
          initial_key = (ulong *)0x0;
        }
        sStack_120 = 0x1329da;
        btree_iterator_init((pfVar2->field_6).seqtree,it_00,initial_key);
        local_90.key = (ulong *)0x0;
        local_90.keylen = 0;
      }
      else {
        chunksize = (ulong)(handle->config).chunksize;
        local_38 = chunksize + 8;
        lVar4 = -(ulong)((int)(chunksize + 8) + 0xfU & 0xfffffff0);
        initial_key_00 = (ulong *)((long)&uStack_118 + lVar4);
        uVar3 = pfVar2->kvs->id;
        *initial_key_00 =
             uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
             (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
             (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
        *(ulong *)((long)&local_110 + lVar4) = local_40;
        *(undefined8 *)((long)&sStack_120 + lVar4) = 1;
        __nmemb = *(size_t *)((long)&sStack_120 + lVar4);
        *(undefined8 *)((long)&sStack_120 + lVar4) = 0x13297a;
        it = (hbtrie_iterator *)calloc(__nmemb,0x98);
        iterator->seqtrie_iterator = it;
        trie = (pfVar2->field_6).seqtrie;
        *(undefined8 *)((long)&sStack_120 + lVar4) = 0x10;
        keylen = *(size_t *)((long)&sStack_120 + lVar4);
        *(undefined8 *)((long)&sStack_120 + lVar4) = 0x132990;
        hbtrie_iterator_init(trie,it,initial_key_00,keylen);
        id = iterator->handle->kvs->id;
        local_90.key = initial_key_00;
        *(undefined8 *)((long)&sStack_120 + lVar4) = 0x1329aa;
        kvid2buf(chunksize,id,initial_key_00);
        local_90.keylen = (uint16_t)local_38;
        *(fdb_seqnum_t *)((long)initial_key_00 + chunksize) = fVar5;
      }
      local_110.seqnum = fVar5;
      wal_itr = iterator->wal_itr;
      initial_key_00[-1] = 0x1329f9;
      pwVar8 = wal_itr_search_greater(wal_itr,&local_110);
      iterator->tree_cursor = pwVar8;
      if (pwVar8 != (wal_item *)0x0) {
        iterator->tree_cursor_start = pwVar8;
      }
      iterator->tree_cursor_prev = pwVar8;
      iterator->direction = '\0';
      iterator->status = '\0';
      iterator->_dhandle = (docio_handle *)0x0;
      *(fdb_iterator **)_start_seq = iterator;
      puVar1 = &iterator->handle->num_iterators;
      *puVar1 = *puVar1 + 1;
      initial_key_00[-1] = 0x132a30;
      fVar6 = fdb_iterator_next(iterator);
      if (fVar6 != FDB_RESULT_FILE_CORRUPTION) {
        return FDB_RESULT_SUCCESS;
      }
      initial_key_00[-1] = 0x132a40;
      fdb_iterator_close(iterator);
      puVar9 = initial_key_00 + -1;
      initial_key_00[-1] = 0xfffffffffffffff0;
    }
    else {
      puVar9 = &sStack_120;
      sStack_120 = 0xffffffffffffffec;
    }
  }
  return (fdb_status)*puVar9;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_sequence_init(fdb_kvs_handle *handle,
                                      fdb_iterator **ptr_iterator,
                                      const fdb_seqnum_t start_seq,
                                      const fdb_seqnum_t end_seq,
                                      fdb_iterator_opt_t opt)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (ptr_iterator == NULL || (end_seq && start_seq > end_seq)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    fdb_status fs;
    fdb_seqnum_t _start_seq = _endian_encode(start_seq);
    fdb_kvs_id_t _kv_id;
    size_t size_id, size_seq;
    uint8_t *start_seq_kv;
    struct wal_item query;
    struct wal_item_header query_key;
    LATENCY_STAT_START();

    query.header = &query_key;

    // Sequence trees are a must for byseq operations
    if (handle->config.seqtree_opt != FDB_SEQTREE_USE) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!handle->shandle) {
        // If compaction is already done before this line,
        // handle->file needs to be replaced with handle->new_file.
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    size_id = sizeof(fdb_kvs_id_t);
    size_seq = sizeof(fdb_seqnum_t);
    fdb_iterator *iterator = (fdb_iterator *)calloc(1, sizeof(fdb_iterator));

    if (!handle->shandle) {
        // snapshot handle doesn't exist
        // open a new handle to make the iterator handle as a snapshot
        fs = fdb_snapshot_open(handle, &iterator->handle, FDB_SNAPSHOT_INMEM);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                    "Failed to create an sequence iterator instance due to the "
                    "failure of "
                    "open operation on the KV Store '%s' in a database file '%s'",
                    _fdb_kvs_get_name(handle, handle->file),
                    handle->file->filename);
            return fs;
        }
        iterator->snapshot_handle = false;
    } else {
        // Snapshot handle exists
        // We don't need to open a new handle.. just point to the snapshot handle.
        iterator->handle = handle;
        iterator->snapshot_handle = true;
    }

    iterator->hbtrie_iterator = NULL;
    iterator->_key = NULL;
    iterator->_keylen = 0;
    iterator->opt = opt;
    iterator->_offset = BLK_NOT_FOUND;
    iterator->_seqnum = start_seq;

    // For easy API call, treat zero seq as 0xffff...
    // (because zero seq number is not used)
    if (end_seq == 0) {
        iterator->end_seqnum = SEQNUM_NOT_USED;
    } else {
        iterator->end_seqnum = end_seq;
    }

    iterator->start_seqnum = start_seq;

    iterator->start_key = NULL;
    iterator->end_key = NULL;

    wal_itr_init(handle->file, iterator->handle->shandle, false,
                 &iterator->wal_itr);

    if (iterator->handle->kvs) {
        int size_chunk = handle->config.chunksize;
        // create an iterator handle for hb-trie
        start_seq_kv = alca(uint8_t, size_chunk + size_seq);
        _kv_id = _endian_encode(iterator->handle->kvs->id);
        memcpy(start_seq_kv, &_kv_id, size_id);
        memcpy(start_seq_kv + size_id, &_start_seq, size_seq);

        iterator->seqtrie_iterator = (struct hbtrie_iterator *)
                                     calloc(1, sizeof(struct hbtrie_iterator));
        hbtrie_iterator_init(iterator->handle->seqtrie,
                             iterator->seqtrie_iterator,
                             start_seq_kv, size_id + size_seq);

        query_key.key = start_seq_kv;
        kvid2buf(size_chunk, iterator->handle->kvs->id, start_seq_kv);
        memcpy(start_seq_kv + size_chunk, &start_seq, size_seq);
        query_key.keylen = size_chunk + size_seq;
        query.seqnum = start_seq;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    } else {
        // create an iterator handle for b-tree
        iterator->seqtree_iterator = (struct btree_iterator *)
                                     calloc(1, sizeof(struct btree_iterator));
        btree_iterator_init(iterator->handle->seqtree,
                            iterator->seqtree_iterator,
                            (void *)(start_seq ? &_start_seq : NULL));
        query_key.key = (void*)NULL;
        query_key.keylen = 0;
        query.seqnum = start_seq;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    }

    // to know reverse iteration endpoint store the start cursor
    if (iterator->tree_cursor) {
        iterator->tree_cursor_start = iterator->tree_cursor;
    }
    iterator->tree_cursor_prev = iterator->tree_cursor;
    iterator->direction = FDB_ITR_DIR_NONE;
    iterator->status = FDB_ITR_IDX;
    iterator->_dhandle = NULL; // populated at the first iterator movement

    *ptr_iterator = iterator;

    ++iterator->handle->num_iterators; // Increment the iterator counter of the KV handle
    fs = fdb_iterator_next(iterator); // position cursor at first key
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_SEQ_INIT);
    if (fs == FDB_RESULT_FILE_CORRUPTION) {
        fdb_iterator_close(iterator);
        return fs;
    }

    return FDB_RESULT_SUCCESS;
}